

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::
tryAddCardOnFoundationPileAndClearHand(EventsProcessorLeftMouseButtonUpEventTests *this,PileId *id)

{
  MockSpec<void_(solitaire::piles::PileId)> *this_00;
  TypedExpectation<void_(solitaire::piles::PileId)> *this_01;
  type local_a0;
  type local_98;
  Action<void_(solitaire::piles::PileId)> local_90;
  WithoutMatchers local_6d [17];
  PileId local_5c;
  Matcher<solitaire::piles::PileId> local_58;
  MockSpec<void_(solitaire::piles::PileId)> local_40;
  Cards *local_20;
  Cards *cardsToClear;
  PileId *id_local;
  EventsProcessorLeftMouseButtonUpEventTests *this_local;
  
  local_20 = &this->cardsInHand;
  cardsToClear = (Cards *)id;
  id_local = (PileId *)this;
  piles::PileId::PileId(&local_5c,id);
  testing::Matcher<solitaire::piles::PileId>::Matcher(&local_58,&local_5c);
  SolitaireMock::gmock_tryAddCardOnFoundationPile
            (&local_40,&(this->super_EventsProcessorTests).solitaireMock.super_SolitaireMock,
             &local_58);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(solitaire::piles::PileId)>::operator()
                      (&local_40,local_6d,(void *)0x0);
  this_01 = testing::internal::MockSpec<void_(solitaire::piles::PileId)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x178,"solitaireMock","tryAddCardOnFoundationPile(id)");
  local_a0.cardsToClear = local_20;
  local_98.cardsToClear =
       (Cards *)testing::
                Invoke<solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::tryAddCardOnFoundationPileAndClearHand(solitaire::piles::PileId)::_lambda()_1_>
                          (&local_a0);
  testing::Action<void(solitaire::piles::PileId)>::
  Action<solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::tryAddCardOnFoundationPileAndClearHand(solitaire::piles::PileId)::_lambda()_1_,void>
            ((Action<void(solitaire::piles::PileId)> *)&local_90,&local_98);
  testing::internal::TypedExpectation<void_(solitaire::piles::PileId)>::WillOnce(this_01,&local_90);
  testing::Action<void_(solitaire::piles::PileId)>::~Action(&local_90);
  testing::internal::MockSpec<void_(solitaire::piles::PileId)>::~MockSpec(&local_40);
  testing::Matcher<solitaire::piles::PileId>::~Matcher(&local_58);
  return;
}

Assistant:

void tryAddCardOnFoundationPileAndClearHand(const PileId id) {
        auto& cardsToClear = cardsInHand;
        EXPECT_CALL(solitaireMock, tryAddCardOnFoundationPile(id))
            .WillOnce(Invoke([&cardsToClear]() { cardsToClear.clear(); }));
    }